

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

string * __thiscall google::protobuf::MapValueRef::GetStringValue_abi_cxx11_(MapValueRef *this)

{
  CppType CVar1;
  LogMessage *other;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff70;
  MapValueRef *in_stack_ffffffffffffffc0;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  CVar1 = type(in_stack_ffffffffffffffc0);
  if (CVar1 != CPPTYPE_STRING) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff70,level,
               (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    FieldDescriptor::CppTypeName(CPPTYPE_STRING);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    CVar1 = type(in_stack_ffffffffffffffc0);
    FieldDescriptor::CppTypeName(CVar1);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)CONCAT44(CVar1,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    internal::LogFinisher::operator=((LogFinisher *)CONCAT44(CVar1,in_stack_ffffffffffffff60),other)
    ;
    internal::LogMessage::~LogMessage((LogMessage *)0x4356be);
  }
  return (string *)*in_RDI;
}

Assistant:

const std::string& GetStringValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_STRING, "MapValueRef::GetStringValue");
    return *reinterpret_cast<std::string*>(data_);
  }